

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_diamond.cc
# Opt level: O2

void consume<long,disruptor::SingleThreadedStrategy,disruptor::BlockingStrategy>
               (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BlockingStrategy,_0>
                *s,unique_ptr<disruptor::SequenceBarrier<disruptor::BlockingStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_>_>
                   *barrier,Sequence *seq)

{
  int64_t iVar1;
  long lVar2;
  int64_t next_seq;
  ulong local_40;
  duration<long,_std::ratio<1L,_1000000L>_> local_38;
  
  local_40 = 0;
  lVar2 = 0;
  while( true ) {
    do {
      local_38.__r = 10000;
      iVar1 = disruptor::SequenceBarrier<disruptor::BlockingStrategy>::
              WaitFor<long,std::ratio<1l,1000000l>>
                        ((barrier->_M_t).
                         super___uniq_ptr_impl<disruptor::SequenceBarrier<disruptor::BlockingStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_disruptor::SequenceBarrier<disruptor::BlockingStrategy>_*,_std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_>_>
                         .
                         super__Head_base<0UL,_disruptor::SequenceBarrier<disruptor::BlockingStrategy>_*,_false>
                         ._M_head_impl,(int64_t *)&local_40,&local_38);
    } while (iVar1 < (long)local_40);
    for (; (long)local_40 <= iVar1; local_40 = local_40 + 1) {
      lVar2 = lVar2 + (s->ring_buffer_).events_.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [local_40 & (long)(s->ring_buffer_).index_mask_];
    }
    (seq->sequence_).super___atomic_base<long>._M_i = iVar1;
    if (iVar1 == expectedValue) break;
    local_40 = iVar1 + 1;
  }
  LOCK();
  sum.super___atomic_base<long>._M_i =
       (__atomic_base<long>)((long)sum.super___atomic_base<long>._M_i + lVar2);
  UNLOCK();
  return;
}

Assistant:

void consume(disruptor::Sequencer<T, C, W>& s,
             std::unique_ptr<disruptor::SequenceBarrier<W> > barrier,
             disruptor::Sequence& seq) {
  int64_t next_seq = disruptor::kFirstSequenceValue;

  int exitCtr = 0;

  int64_t localSum = 0;

  while (true) {
#ifdef PRINT_DEBUG_CONS
    std::stringstream ss;
    ss << "Wait for next seq: " << next_seq << ' ' << std::this_thread::get_id()
       << '\n';
    std::cout << ss.str();
#endif

    int64_t available_seq =
        barrier->WaitFor(next_seq, std::chrono::microseconds(10000));

#ifdef PRINT_DEBUG_CONS
    ss.clear();
    ss.str(std::string());
    ss << "Available seq: " << available_seq << ' '
       << std::this_thread::get_id() << '\n';
    std::cout << ss.str();
#endif

    if (available_seq < next_seq) continue;

    // Only required for claim strategy MultiThreadedStrategyEx as it changes
    // the cursor.
    available_seq = s.GetHighestPublishedSequence(next_seq, available_seq);
    if (available_seq < next_seq) {
      ++exitCtr;

#ifdef PRINT_DEBUG_CONS
      ss.clear();
      ss.str(std::string());
      ss << "Highest published seq: " << available_seq << ' '
         << std::this_thread::get_id() << '\n';
      std::cout << ss.str();
#endif
      // Otherwise goes into a busy loop with blocking strategy
      if (exitCtr > 10)
        std::this_thread::sleep_for(std::chrono::microseconds(1));
      continue;
    }

    for (int64_t i = next_seq; i <= available_seq; ++i) {
      int64_t ev = s[i];
#ifdef PRINT_DEBUG_CONS
      std::cout << i << " Event: " << ev << '\n';
#endif
      localSum += ev;
    }

    seq.set_sequence(available_seq);

    if (available_seq == expectedValue)
      break;

    next_seq = available_seq + 1;

    exitCtr = 0;
  }

  sum.fetch_add(localSum, std::memory_order_relaxed);
}